

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# builder.cc
# Opt level: O2

Builder<prometheus::Histogram> * prometheus::BuildHistogram(void)

{
  Builder<prometheus::Histogram> *in_RDI;
  
  (in_RDI->help_).field_2._M_allocated_capacity = 0;
  *(undefined8 *)((long)&(in_RDI->help_).field_2 + 8) = 0;
  (in_RDI->help_)._M_dataplus._M_p = (pointer)0x0;
  (in_RDI->help_)._M_string_length = 0;
  (in_RDI->name_).field_2._M_allocated_capacity = 0;
  *(undefined8 *)((long)&(in_RDI->name_).field_2 + 8) = 0;
  (in_RDI->name_)._M_dataplus._M_p = (pointer)0x0;
  (in_RDI->name_)._M_string_length = 0;
  (in_RDI->labels_)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
  (in_RDI->labels_)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (in_RDI->labels_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (in_RDI->labels_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)0x0;
  *(undefined8 *)&(in_RDI->labels_)._M_t._M_impl = 0;
  *(undefined8 *)&(in_RDI->labels_)._M_t._M_impl.super__Rb_tree_header._M_header = 0;
  detail::Builder<prometheus::Histogram>::Builder(in_RDI);
  return in_RDI;
}

Assistant:

detail::Builder<Histogram> BuildHistogram() { return {}; }